

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Type * __thiscall
slang::ast::GenericClassDefSymbol::getDefaultSpecialization
          (GenericClassDefSymbol *this,Scope *scope)

{
  LookupLocation lookupLocation;
  bool bVar1;
  Type **ppTVar2;
  Type **in_RSI;
  Scope *in_RDI;
  Type *result;
  ParameterValueAssignmentSyntax *in_stack_000004f8;
  undefined1 in_stack_00000507;
  ASTContext *in_stack_00000508;
  GenericClassDefSymbol *in_stack_00000510;
  SourceLocation in_stack_00000518;
  Symbol *in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff80;
  Scope *in_stack_ffffffffffffff88;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff90;
  Scope *in_stack_ffffffffffffffa8;
  Type *local_8;
  
  bVar1 = std::optional::operator_cast_to_bool((optional<const_slang::ast::Type_*> *)0xf83ab0);
  if (bVar1) {
    ppTVar2 = std::optional<const_slang::ast::Type_*>::operator*
                        ((optional<const_slang::ast::Type_*> *)0xf83ac7);
    local_8 = *ppTVar2;
  }
  else {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff90,None);
    lookupLocation._8_8_ = in_stack_ffffffffffffff90.m_bits;
    lookupLocation.scope = in_stack_ffffffffffffff88;
    ASTContext::ASTContext
              ((ASTContext *)in_stack_ffffffffffffff78,in_RDI,lookupLocation,
               in_stack_ffffffffffffff80);
    local_8 = getSpecializationImpl
                        (in_stack_00000510,in_stack_00000508,in_stack_00000518,
                         (bool)in_stack_00000507,in_stack_000004f8);
    bVar1 = Scope::isUninstantiated(in_stack_ffffffffffffffa8);
    if (!bVar1) {
      std::optional<const_slang::ast::Type_*>::optional<const_slang::ast::Type_*&,_true>
                ((optional<const_slang::ast::Type_*> *)in_RDI,in_RSI);
      in_RDI[0xc].lastMember = in_stack_ffffffffffffff78;
      *(underlying_type *)&in_RDI[0xc].deferredMemberIndex = in_stack_ffffffffffffff80.m_bits;
    }
  }
  return local_8;
}

Assistant:

const Type* GenericClassDefSymbol::getDefaultSpecialization(const Scope& scope) const {
    if (defaultSpecialization)
        return *defaultSpecialization;

    auto result = getSpecializationImpl(ASTContext(scope, LookupLocation::max), location,
                                        /* forceInvalidParams */ false, nullptr);
    if (!scope.isUninstantiated())
        defaultSpecialization = result;
    return result;
}